

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O2

void __thiscall BuildStatus::PrintStatus(BuildStatus *this,Edge *edge,EdgeStatus status)

{
  int iVar1;
  string to_print;
  allocator<char> local_a9;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  iVar1 = *(int *)this->config_;
  if (iVar1 != 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"description",(allocator<char> *)&local_a8);
    Edge::GetBinding(&local_68,edge,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    if ((iVar1 == 2) || (local_68._M_string_length == 0)) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"command",&local_a9);
      Edge::GetBinding(&local_88,edge,&local_a8);
      std::__cxx11::string::operator=((string *)&local_68,(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    FormatProgressStatus_abi_cxx11_(&local_a8,this,this->progress_status_format_,status);
    std::operator+(&local_88,&local_a8,&local_68);
    std::__cxx11::string::operator=((string *)&local_68,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::string((string *)&local_48,(string *)&local_68);
    LinePrinter::Print(&this->printer_,&local_48,(uint)(iVar1 != 2));
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return;
}

Assistant:

void BuildStatus::PrintStatus(const Edge* edge, EdgeStatus status) {
  if (config_.verbosity == BuildConfig::QUIET)
    return;

  bool force_full_command = config_.verbosity == BuildConfig::VERBOSE;

  string to_print = edge->GetBinding("description");
  if (to_print.empty() || force_full_command)
    to_print = edge->GetBinding("command");

  to_print = FormatProgressStatus(progress_status_format_, status) + to_print;

  printer_.Print(to_print,
                 force_full_command ? LinePrinter::FULL : LinePrinter::ELIDE);
}